

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

void __thiscall cmProcess::~cmProcess(cmProcess *this)

{
  cmProcess *this_local;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&this->ProcessArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Arguments);
  std::__cxx11::string::~string((string *)&this->WorkingDirectory);
  std::__cxx11::string::~string((string *)&this->Command);
  Buffer::~Buffer(&this->Output);
  std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr(&this->Runner);
  std::vector<char,_std::allocator<char>_>::~vector(&this->Buf);
  ::cm::uv_timer_ptr::~uv_timer_ptr(&this->Timer);
  ::cm::uv_pipe_ptr::~uv_pipe_ptr(&this->PipeReader);
  ::cm::uv_process_ptr::~uv_process_ptr(&this->Process);
  return;
}

Assistant:

cmProcess::~cmProcess() = default;